

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_distinct.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalDistinct *op)

{
  pointer pLVar1;
  pointer pLVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var5;
  ClientContext *pCVar6;
  iterator iVar7;
  optional_ptr<duckdb::Binder,_true> oVar8;
  undefined8 uVar9;
  PhysicalPlanGenerator *pPVar10;
  profiler_settings_t *this_00;
  reference this_01;
  type op_00;
  reference this_02;
  pointer pEVar11;
  BoundReferenceExpression *pBVar12;
  mapped_type *pmVar13;
  const_reference other;
  pointer pBVar14;
  ClientConfig *pCVar15;
  type aggr;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_03;
  PhysicalOperator *pPVar16;
  pointer pPVar17;
  Binder *pBVar18;
  Binder *pBVar19;
  InternalException *this_04;
  long lVar20;
  pointer *__ptr;
  __hash_code __code;
  size_type __n;
  _Hash_node_base *__n_00;
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *this_05;
  bool bVar21;
  bool changes_made;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  first_children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregates;
  reference<PhysicalOperator> child;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  groups;
  vector<duckdb::LogicalType,_true> aggregate_types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projections;
  FunctionBinder function_binder;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  group_by_references;
  value_type logical_type;
  FunctionBinder local_2e8;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_2d8;
  long *local_2d0;
  undefined1 local_2c8 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_2a8;
  long local_288;
  PhysicalOperator *local_280;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_278;
  PhysicalPlanGenerator *local_260;
  vector<duckdb::LogicalType,_true> *local_258;
  reference_wrapper<duckdb::PhysicalOperator> local_250;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_248;
  vector<duckdb::LogicalType,_true> local_228;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_208;
  pointer local_1e8;
  profiler_settings_t *local_1e0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1d8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [24];
  _Alloc_hider _Stack_198;
  float local_190;
  undefined1 local_188 [16];
  LogicalType local_178;
  AggregateFunction local_160;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_01);
  local_280 = CreatePlan(this,op_00);
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0._0_8_ = local_188 + 8;
  local_1b0._8_8_ = 1;
  local_1b0._16_8_ = 0;
  _Stack_198._M_p = (pointer)0x0;
  local_190 = 1.0;
  local_188._0_8_ = 0;
  local_188._8_8_ = 0;
  local_228.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288 = (long)(op->distinct_targets).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(op->distinct_targets).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_2e8.context = (ClientContext *)op;
  local_250._M_data = local_280;
  if (local_288 != 0) {
    __n = 0;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&op->distinct_targets,__n);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_02);
      if ((pEVar11->super_BaseExpression).type == BOUND_REF) {
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_02);
        pBVar12 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                            (&pEVar11->super_BaseExpression);
        pmVar13 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_1b0,&pBVar12->index);
        *pmVar13 = __n;
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_02);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_228,
                 &pEVar11->return_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_248,this_02);
      __n = __n + 1;
    } while (__n < (ulong)((long)(((local_2e8.context)->config).profiler_save_location.field_2.
                                  _M_allocated_capacity -
                                 ((local_2e8.context)->config).profiler_save_location.
                                 _M_string_length) >> 3));
  }
  local_258 = &local_280->types;
  local_288 = local_288 >> 3;
  pLVar1 = (local_280->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (local_280->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar21 = ((long)pLVar1 - (long)pLVar2 >> 3) * -0x5555555555555555 - local_288 != 0;
  local_260 = this;
  if (pLVar1 != pLVar2) {
    local_1e0 = &((local_2e8.context)->config).profiler_settings;
    local_1e8 = (pointer)&PTR__AggregateFunction_02433f70;
    __n_00 = (_Hash_node_base *)0x0;
    do {
      other = vector<duckdb::LogicalType,_true>::operator[](local_258,(size_type)__n_00);
      LogicalType::LogicalType(&local_178,other);
      if (*(__buckets_ptr)(local_1b0._0_8_ + ((ulong)__n_00 % (ulong)local_1b0._8_8_) * 8) !=
          (__node_base_ptr)0x0) {
        p_Var3 = (*(__buckets_ptr)(local_1b0._0_8_ + ((ulong)__n_00 % (ulong)local_1b0._8_8_) * 8))
                 ->_M_nxt;
        p_Var4 = p_Var3[1]._M_nxt;
        do {
          if (__n_00 == p_Var4) {
            p_Var3 = p_Var3[2]._M_nxt;
            pBVar12 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_2c8,&local_178);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar12,(LogicalType *)local_2c8,(storage_t)p_Var3);
            LogicalType::~LogicalType((LogicalType *)local_2c8);
            local_2a8.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar12;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_208,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_2a8);
            if ((BoundReferenceExpression *)
                local_2a8.
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (BoundReferenceExpression *)0x0) {
              (*(((Expression *)
                 &(local_2a8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            bVar21 = (bool)(bVar21 | p_Var3 != __n_00);
            goto LAB_01590874;
          }
          p_Var3 = p_Var3->_M_nxt;
        } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                (p_Var4 = p_Var3[1]._M_nxt,
                (ulong)p_Var4 % (ulong)local_1b0._8_8_ == (ulong)__n_00 % (ulong)local_1b0._8_8_));
      }
      if ((*(char *)((long)&((local_2e8.context)->config).profiler_save_location._M_dataplus._M_p +
                    1) == '\0') &&
         (((local_2e8.context)->config).profiler_settings._M_h._M_buckets != (__buckets_ptr)0x0)) {
        this_04 = (InternalException *)__cxa_allocate_exception(0x10);
        local_2c8._0_8_ = local_2c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2c8,"Entry that is not a group, but not a DISTINCT ON aggregate",
                   "");
        InternalException::InternalException(this_04,(string *)local_2c8);
        __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar16 = (PhysicalOperator *)operator_new(0x60);
      this_00 = local_1e0;
      pPVar10 = local_260;
      LogicalType::LogicalType((LogicalType *)local_2c8,&local_178);
      BoundReferenceExpression::BoundReferenceExpression
                ((BoundReferenceExpression *)pPVar16,(LogicalType *)local_2c8,(storage_t)__n_00);
      LogicalType::~LogicalType((LogicalType *)local_2c8);
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8._0_8_ = pPVar16;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_2a8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_2c8);
      if ((PhysicalOperator *)local_2c8._0_8_ != (PhysicalOperator *)0x0) {
        (*(((Expression *)local_2c8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      FunctionBinder::FunctionBinder((FunctionBinder *)local_1c0,pPVar10->context);
      FirstFunctionGetter::GetFunction(&local_160,&local_178);
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_2a8.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2a8.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_2a8.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d0 = (long *)0x0;
      FunctionBinder::BindAggregateFunction
                (&local_2e8,(AggregateFunction *)local_1c0,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_160,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_1d8,(AggregateType)&local_2d0);
      if (local_2d0 != (long *)0x0) {
        (**(code **)(*local_2d0 + 8))();
      }
      local_2d0 = (long *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_1d8);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)local_1e8;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      if ((((__uniq_ptr_data<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true,_true>
             *)&(this_00->_M_h)._M_buckets)->
          super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          )._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
          .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl ==
          (BoundOrderModifier *)0x0) {
        local_2c8._0_8_ = (PhysicalOperator *)0x0;
      }
      else {
        unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
        ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                      *)this_00);
        BoundOrderModifier::Copy((BoundOrderModifier *)local_2c8);
      }
      pBVar14 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                              *)&local_2e8);
      uVar9 = local_2c8._0_8_;
      local_2c8._0_8_ = (Binder *)0x0;
      _Var5._M_head_impl =
           (pBVar14->order_bys).
           super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
           .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
      (pBVar14->order_bys).
      super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
      .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
           (BoundOrderModifier *)uVar9;
      if ((_Var5._M_head_impl != (BoundOrderModifier *)0x0) &&
         ((**(code **)(*(long *)&(_Var5._M_head_impl)->super_BoundResultModifier + 8))(),
         (Binder *)local_2c8._0_8_ != (Binder *)0x0)) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_2c8._0_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      pCVar15 = ClientConfig::GetConfig(pPVar10->context);
      if (pCVar15->enable_optimizer == true) {
        local_2d8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)
             ((ulong)local_2d8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl &
             0xffffffffffffff00);
        pCVar6 = pPVar10->context;
        aggr = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
               ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_2e8);
        OrderedAggregateOptimizer::Apply
                  ((OrderedAggregateOptimizer *)local_2c8,pCVar6,aggr,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&local_248,(bool *)&local_2d8);
        uVar9 = local_2c8._0_8_;
        oVar8.ptr = local_2e8.binder.ptr;
        if ((Binder *)local_2c8._0_8_ != (Binder *)0x0) {
          local_2c8._0_8_ = (Binder *)0x0;
          local_2e8.binder.ptr = (Binder *)uVar9;
          if ((oVar8.ptr != (Binder *)0x0) &&
             ((*(code *)((((oVar8.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                          internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                        internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)(), (Binder *)local_2c8._0_8_ != (Binder *)0x0)) {
            (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_2c8._0_8_)->__weak_this_)
                        .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                      .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)();
          }
        }
      }
      lVar20 = (long)local_278.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      this_03._M_head_impl = (Expression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)local_2c8,&local_178);
      BoundReferenceExpression::BoundReferenceExpression
                ((BoundReferenceExpression *)this_03._M_head_impl,(LogicalType *)local_2c8,
                 local_288 + (lVar20 >> 3));
      LogicalType::~LogicalType((LogicalType *)local_2c8);
      local_2d8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)
           (_Head_base<0UL,_duckdb::Expression_*,_false>)this_03._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_208,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2d8);
      if (local_2d8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (Expression *)0x0) {
        (**(code **)(*(long *)local_2d8.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                              _M_head_impl + 8))();
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_228,
                 &local_178);
      local_2c8._0_8_ = local_2e8.binder.ptr;
      local_2e8.binder.ptr = (Binder *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_278,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_2c8);
      if ((Binder *)local_2c8._0_8_ != (Binder *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_2c8._0_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      if (local_2e8.binder.ptr != (Binder *)0x0) {
        (*(code *)((((local_2e8.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_2a8);
      bVar21 = true;
LAB_01590874:
      LogicalType::~LogicalType(&local_178);
      __n_00 = (_Hash_node_base *)((long)&__n_00->_M_nxt + 1);
    } while (__n_00 < (_Hash_node_base *)
                      (((long)(local_280->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_280->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
            );
  }
  pPVar10 = local_260;
  pPVar16 = ExtractAggregateExpressions
                      (local_260,local_280,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_278,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_248);
  pCVar6 = pPVar10->context;
  this_05 = &pPVar10->physical_plan;
  local_250._M_data = pPVar16;
  pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(this_05);
  pBVar18 = (Binder *)
            PhysicalPlan::
            Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                      (pPVar17,pCVar6,&local_228,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_278,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_248,&pPVar16->estimated_cardinality);
  iVar7._M_current =
       (reference_wrapper<duckdb::PhysicalOperator> *)(pBVar18->CTE_bindings)._M_h._M_buckets;
  if (iVar7._M_current ==
      (reference_wrapper<duckdb::PhysicalOperator> *)(pBVar18->CTE_bindings)._M_h._M_bucket_count) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>const&>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pBVar18->context,iVar7,&local_250);
  }
  else {
    (iVar7._M_current)->_M_data = pPVar16;
    (pBVar18->CTE_bindings)._M_h._M_buckets =
         (__buckets_ptr)((pointer)(pBVar18->CTE_bindings)._M_h._M_buckets + 1);
  }
  pBVar19 = pBVar18;
  if (bVar21) {
    pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(this_05);
    pBVar19 = (Binder *)
              PhysicalPlan::
              Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                        (pPVar17,local_258,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_208,&(pBVar18->CTE_bindings)._M_h._M_rehash_policy._M_next_resize
                        );
    iVar7._M_current =
         (reference_wrapper<duckdb::PhysicalOperator> *)(pBVar19->CTE_bindings)._M_h._M_buckets;
    local_2c8._0_8_ = pBVar18;
    if (iVar7._M_current ==
        (reference_wrapper<duckdb::PhysicalOperator> *)(pBVar19->CTE_bindings)._M_h._M_bucket_count)
    {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&pBVar19->context,iVar7,(reference_wrapper<duckdb::PhysicalOperator> *)local_2c8
                );
    }
    else {
      (iVar7._M_current)->_M_data = (PhysicalOperator *)pBVar18;
      (pBVar19->CTE_bindings)._M_h._M_buckets =
           (__buckets_ptr)((pointer)(pBVar19->CTE_bindings)._M_h._M_buckets + 1);
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_228);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_208);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_278);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_248);
  return (PhysicalOperator *)pBVar19;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalDistinct &op) {
	D_ASSERT(op.children.size() == 1);
	reference<PhysicalOperator> child = CreatePlan(*op.children[0]);
	auto &distinct_targets = op.distinct_targets;
	D_ASSERT(!distinct_targets.empty());

	auto &types = child.get().GetTypes();
	vector<unique_ptr<Expression>> groups, aggregates, projections;
	idx_t group_count = distinct_targets.size();
	unordered_map<idx_t, idx_t> group_by_references;
	vector<LogicalType> aggregate_types;
	// creates one group per distinct_target
	for (idx_t i = 0; i < distinct_targets.size(); i++) {
		auto &target = distinct_targets[i];
		if (target->GetExpressionType() == ExpressionType::BOUND_REF) {
			auto &bound_ref = target->Cast<BoundReferenceExpression>();
			group_by_references[bound_ref.index] = i;
		}
		aggregate_types.push_back(target->return_type);
		groups.push_back(std::move(target));
	}
	bool requires_projection = false;
	if (types.size() != group_count) {
		requires_projection = true;
	}
	// we need to create one aggregate per column in the select_list
	for (idx_t i = 0; i < types.size(); ++i) {
		auto logical_type = types[i];
		// check if we can directly refer to a group, or if we need to push an aggregate with FIRST
		auto entry = group_by_references.find(i);
		if (entry != group_by_references.end()) {
			auto group_index = entry->second;
			// entry is found: can directly refer to a group
			projections.push_back(make_uniq<BoundReferenceExpression>(logical_type, group_index));
			if (group_index != i) {
				// we require a projection only if this group element is out of order
				requires_projection = true;
			}
		} else {
			if (op.distinct_type == DistinctType::DISTINCT && op.order_by) {
				throw InternalException("Entry that is not a group, but not a DISTINCT ON aggregate");
			}
			// entry is not one of the groups: need to push a FIRST aggregate
			auto bound = make_uniq<BoundReferenceExpression>(logical_type, i);
			vector<unique_ptr<Expression>> first_children;
			first_children.push_back(std::move(bound));

			FunctionBinder function_binder(context);
			auto first_aggregate =
			    function_binder.BindAggregateFunction(FirstFunctionGetter::GetFunction(logical_type),
			                                          std::move(first_children), nullptr, AggregateType::NON_DISTINCT);
			first_aggregate->order_bys = op.order_by ? op.order_by->Copy() : nullptr;

			if (ClientConfig::GetConfig(context).enable_optimizer) {
				bool changes_made = false;
				auto new_expr = OrderedAggregateOptimizer::Apply(context, *first_aggregate, groups, changes_made);
				if (new_expr) {
					D_ASSERT(new_expr->return_type == first_aggregate->return_type);
					D_ASSERT(new_expr->GetExpressionType() == ExpressionType::BOUND_AGGREGATE);
					first_aggregate = unique_ptr_cast<Expression, BoundAggregateExpression>(std::move(new_expr));
				}
			}
			// add the projection
			projections.push_back(make_uniq<BoundReferenceExpression>(logical_type, group_count + aggregates.size()));
			// push it to the list of aggregates
			aggregate_types.push_back(logical_type);
			aggregates.push_back(std::move(first_aggregate));
			requires_projection = true;
		}
	}

	child = ExtractAggregateExpressions(child, aggregates, groups);

	// we add a physical hash aggregation in the plan to select the distinct groups
	auto &group_by = Make<PhysicalHashAggregate>(context, aggregate_types, std::move(aggregates), std::move(groups),
	                                             child.get().estimated_cardinality);
	group_by.children.push_back(child);
	if (!requires_projection) {
		return group_by;
	}

	// we add a physical projection on top of the aggregation to project all members in the select list
	auto &proj = Make<PhysicalProjection>(types, std::move(projections), group_by.estimated_cardinality);
	proj.children.push_back(group_by);
	return proj;
}